

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,ImDrawFlags flags,
          float thickness)

{
  uint uVar1;
  ImVec4 *pIVar2;
  ImVec2 IVar3;
  ImVec4 *pIVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImVec2 *pIVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ImDrawListSharedData *pIVar13;
  ImVec2 *pIVar14;
  int iVar15;
  ImDrawVert *pIVar16;
  byte bVar17;
  uint uVar18;
  ulong uVar19;
  uint *puVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  bool bVar28;
  float fVar29;
  ImVec2 IVar30;
  float fVar35;
  ImVec2 IVar31;
  ImVec2 IVar32;
  ImVec2 IVar33;
  ImVec2 IVar34;
  float fVar36;
  float fVar37;
  float fVar44;
  ImVec2 IVar38;
  ImVec2 IVar39;
  ImVec2 IVar40;
  ImVec2 IVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar45;
  ImVec2 IVar46;
  ImVec2 IVar47;
  ImVec2 IVar48;
  ImVec2 IVar49;
  ImVec2 IVar50;
  ImVec2 IVar51;
  ImVec2 IVar52;
  
  if (0xffffff < col && 1 < points_count) {
    uVar22 = points_count - 1;
    IVar3 = this->_Data->TexUvWhitePixel;
    uVar24 = points_count;
    if ((flags & 1U) == 0) {
      uVar24 = uVar22;
    }
    uVar25 = (ulong)uVar24;
    if ((this->Flags & 1U) == 0) {
      PrimReserve(this,uVar24 * 6,uVar24 * 4);
      uVar26 = 1;
      do {
        uVar9 = uVar26 & 0xffffffff;
        if ((uint)points_count == uVar26) {
          uVar9 = 0;
        }
        fVar29 = points[uVar26 - 1].x;
        fVar36 = points[uVar9].x - fVar29;
        fVar35 = points[uVar26 - 1].y;
        auVar42._4_4_ = points[uVar9].y - fVar35;
        auVar42._0_4_ = fVar36 * fVar36 + auVar42._4_4_ * auVar42._4_4_;
        auVar42._8_8_ = 0;
        if (0.0 < auVar42._0_4_) {
          auVar43 = rsqrtss(auVar42,auVar42);
          auVar42._4_4_ = auVar42._4_4_ * auVar43._0_4_;
          fVar36 = fVar36 * auVar43._0_4_;
        }
        auVar42._4_4_ = auVar42._4_4_ * thickness * 0.5;
        fVar36 = fVar36 * thickness * 0.5;
        pIVar16 = this->_VtxWritePtr;
        IVar30.y = fVar35 - fVar36;
        IVar30.x = fVar29 + auVar42._4_4_;
        pIVar16->pos = IVar30;
        pIVar16->uv = IVar3;
        pIVar16 = this->_VtxWritePtr;
        pIVar16->col = col;
        pIVar16[1].pos.x = points[uVar9].x + auVar42._4_4_;
        pIVar16[1].pos.y = points[uVar9].y - fVar36;
        pIVar16[1].uv = IVar3;
        pIVar16 = this->_VtxWritePtr;
        pIVar16[1].col = col;
        pIVar16[2].pos.x = points[uVar9].x - auVar42._4_4_;
        pIVar16[2].pos.y = points[uVar9].y + fVar36;
        pIVar16[2].uv = IVar3;
        pIVar16 = this->_VtxWritePtr;
        pIVar16[2].col = col;
        pIVar16[3].pos.x = points[uVar26 - 1].x - auVar42._4_4_;
        pIVar16[3].pos.y = points[uVar26 - 1].y + fVar36;
        pIVar16[3].uv = IVar3;
        pIVar16 = this->_VtxWritePtr;
        pIVar16[3].col = col;
        this->_VtxWritePtr = pIVar16 + 4;
        uVar22 = this->_VtxCurrentIdx;
        puVar20 = this->_IdxWritePtr;
        *puVar20 = uVar22;
        puVar20[1] = uVar22 + 1;
        puVar20[2] = this->_VtxCurrentIdx + 2;
        uVar22 = this->_VtxCurrentIdx;
        puVar20[3] = uVar22;
        puVar20[4] = uVar22 + 2;
        puVar20[5] = this->_VtxCurrentIdx + 3;
        this->_IdxWritePtr = puVar20 + 6;
        this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
        bVar28 = uVar26 != uVar25;
        uVar26 = uVar26 + 1;
      } while (bVar28);
    }
    else {
      auVar42._4_4_ = thickness;
      if (thickness <= 1.0) {
        auVar42._4_4_ = 1.0;
      }
      iVar10 = (int)auVar42._4_4_;
      fVar36 = this->_FringeScale;
      bVar17 = fVar36 == 1.0 & iVar10 < 0x3f & (byte)this->Flags >> 1 &
               auVar42._4_4_ - (float)iVar10 <= 1e-05;
      iVar11 = 0x12;
      if (thickness <= fVar36) {
        iVar11 = 0xc;
      }
      iVar15 = 6;
      if (bVar17 == 0) {
        iVar15 = iVar11;
      }
      if (bVar17 == 1) {
        iVar11 = points_count * 2;
        iVar23 = 3;
      }
      else {
        iVar11 = points_count * 3;
        if (fVar36 < thickness) {
          iVar11 = points_count * 4;
        }
        iVar23 = (uint)(fVar36 < thickness) * 2 + 3;
      }
      PrimReserve(this,iVar15 * uVar24,iVar11);
      pIVar13 = this->_Data;
      uVar24 = iVar23 * points_count;
      if ((pIVar13->TempBuffer).Capacity < (int)uVar24) {
        pIVar8 = (pIVar13->TempBuffer).Data;
        if (pIVar8 != (ImVec2 *)0x0) {
          ImGui::MemFree(pIVar8);
        }
        pIVar8 = (ImVec2 *)ImGui::MemAlloc((ulong)uVar24 << 3);
        (pIVar13->TempBuffer).Data = pIVar8;
        (pIVar13->TempBuffer).Capacity = uVar24;
        pIVar13 = this->_Data;
      }
      uVar24 = col & 0xffffff;
      pIVar14 = (pIVar13->TempBuffer).Data;
      uVar9 = (ulong)(uint)points_count;
      pIVar8 = pIVar14 + uVar9;
      uVar26 = 1;
      do {
        uVar21 = uVar26 & 0xffffffff;
        if (uVar9 == uVar26) {
          uVar21 = 0;
        }
        fVar29 = points[uVar21].x - points[uVar26 - 1].x;
        fVar35 = points[uVar21].y - points[uVar26 - 1].y;
        auVar43._0_4_ = fVar29 * fVar29 + fVar35 * fVar35;
        auVar43._4_4_ = fVar35;
        auVar43._8_8_ = 0;
        if (0.0 < auVar43._0_4_) {
          auVar43 = rsqrtss(auVar43,auVar43);
          fVar29 = fVar29 * auVar43._0_4_;
          fVar35 = fVar35 * auVar43._0_4_;
        }
        pIVar14[uVar26 - 1].x = fVar35;
        pIVar14[uVar26 - 1].y = -fVar29;
        bVar28 = uVar26 != uVar25;
        uVar26 = uVar26 + 1;
      } while (bVar28);
      if ((flags & 1U) == 0) {
        pIVar14[uVar22] = pIVar8[-2];
        if (thickness <= fVar36 || bVar17 != 0) {
          if (bVar17 != 0) {
            fVar36 = auVar42._4_4_ * 0.5 + 1.0;
          }
          IVar31.x = (*points).x + (*pIVar14).x * fVar36;
          IVar31.y = (*points).y + (*pIVar14).y * fVar36;
          *pIVar8 = IVar31;
          IVar32.x = (*points).x - (*pIVar14).x * fVar36;
          IVar32.y = (*points).y - (*pIVar14).y * fVar36;
          pIVar8[1] = IVar32;
          IVar33.x = points[uVar22].x + pIVar14[uVar22].x * fVar36;
          IVar33.y = points[uVar22].y + pIVar14[uVar22].y * fVar36;
          pIVar8[uVar22 * 2] = IVar33;
          IVar6.y = points[uVar22].y - pIVar14[uVar22].y * fVar36;
          IVar6.x = points[uVar22].x - pIVar14[uVar22].x * fVar36;
          pIVar8[(ulong)(uVar22 * 2) + 1] = IVar6;
LAB_0019caaf:
          puVar20 = this->_IdxWritePtr;
          uVar26 = 1;
          uVar22 = this->_VtxCurrentIdx;
LAB_0019cae0:
          uVar21 = uVar26 & 0xffffffff;
          if (uVar9 == uVar26) {
            uVar21 = 0;
          }
          uVar27 = uVar22 + (bVar17 ^ 3);
          if (uVar9 == uVar26) {
            uVar27 = this->_VtxCurrentIdx;
          }
          auVar42._4_4_ = (pIVar14[uVar21].x + pIVar14[uVar26 - 1].x) * 0.5;
          fVar29 = (pIVar14[uVar21].y + pIVar14[uVar26 - 1].y) * 0.5;
          fVar35 = auVar42._4_4_ * auVar42._4_4_ + fVar29 * fVar29;
          if (1e-06 < fVar35) {
            fVar35 = 1.0 / fVar35;
            fVar45 = 100.0;
            if (fVar35 <= 100.0) {
              fVar45 = fVar35;
            }
            auVar42._4_4_ = auVar42._4_4_ * fVar45;
            fVar29 = fVar29 * fVar45;
          }
          uVar19 = (ulong)(uint)((int)uVar21 * 2);
          IVar46.x = points[uVar21].x + auVar42._4_4_ * fVar36;
          IVar46.y = points[uVar21].y + fVar29 * fVar36;
          pIVar8[uVar19] = IVar46;
          IVar47.x = points[uVar21].x - auVar42._4_4_ * fVar36;
          IVar47.y = points[uVar21].y - fVar29 * fVar36;
          pIVar8[uVar19 + 1] = IVar47;
          *puVar20 = uVar27;
          puVar20[1] = uVar22;
          if (bVar17 == 0) {
            puVar20[2] = uVar22 + 2;
            puVar20[3] = uVar22 + 2;
            puVar20[4] = uVar27 + 2;
            puVar20[5] = uVar27;
            puVar20[6] = uVar27 + 1;
            puVar20[7] = uVar22 + 1;
            puVar20[8] = uVar22;
            puVar20[9] = uVar22;
            puVar20[10] = uVar27;
            puVar20[0xb] = uVar27 + 1;
            puVar20 = puVar20 + 0xc;
            this->_IdxWritePtr = puVar20;
            if (uVar25 != uVar26) goto LAB_0019cbdb;
            pIVar16 = this->_VtxWritePtr;
            pIVar14 = pIVar14 + uVar9 + 1;
            uVar25 = 0;
            do {
              pIVar16->pos = points[uVar25];
              this->_VtxWritePtr->uv = IVar3;
              pIVar16 = this->_VtxWritePtr;
              pIVar16->col = col;
              pIVar16[1].pos = pIVar14[-1];
              this->_VtxWritePtr[1].uv = IVar3;
              pIVar16 = this->_VtxWritePtr;
              pIVar16[1].col = uVar24;
              pIVar16[2].pos = *pIVar14;
              this->_VtxWritePtr[2].uv = IVar3;
              pIVar16 = this->_VtxWritePtr;
              pIVar16[2].col = uVar24;
              pIVar16 = pIVar16 + 3;
              this->_VtxWritePtr = pIVar16;
              uVar25 = uVar25 + 1;
              pIVar14 = pIVar14 + 2;
            } while (uVar9 != uVar25);
          }
          else {
            puVar20[2] = uVar22 + 1;
            puVar20[3] = uVar27 + 1;
            puVar20[4] = uVar22 + 1;
            puVar20[5] = uVar27;
            puVar20 = puVar20 + 6;
            this->_IdxWritePtr = puVar20;
            if (uVar25 != uVar26) goto LAB_0019cbdb;
            pIVar16 = this->_VtxWritePtr;
            pIVar4 = this->_Data->TexUvLines;
            pIVar2 = pIVar4 + iVar10;
            auVar42._4_4_ = pIVar2->x;
            fVar36 = pIVar2->y;
            pIVar4 = pIVar4 + iVar10;
            fVar29 = pIVar4->z;
            fVar35 = pIVar4->w;
            pIVar14 = pIVar14 + uVar9 + 1;
            do {
              pIVar16->pos = pIVar14[-1];
              pIVar16 = this->_VtxWritePtr;
              (pIVar16->uv).x = auVar42._4_4_;
              (pIVar16->uv).y = fVar36;
              pIVar16 = this->_VtxWritePtr;
              pIVar16->col = col;
              pIVar16[1].pos = *pIVar14;
              pIVar16 = this->_VtxWritePtr;
              pIVar16[1].uv.x = fVar29;
              pIVar16[1].uv.y = fVar35;
              pIVar16 = this->_VtxWritePtr;
              pIVar16[1].col = col;
              pIVar16 = pIVar16 + 2;
              this->_VtxWritePtr = pIVar16;
              pIVar14 = pIVar14 + 2;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
          }
          goto LAB_0019cf73;
        }
        auVar42._4_4_ = (auVar42._4_4_ - fVar36) * 0.5;
        fVar29 = fVar36 + auVar42._4_4_;
        IVar34.x = (*points).x + (*pIVar14).x * fVar29;
        IVar34.y = (*points).y + (*pIVar14).y * fVar29;
        *pIVar8 = IVar34;
        fVar35 = (*pIVar14).x;
        fVar37 = auVar42._4_4_ * fVar35;
        fVar45 = (*pIVar14).y;
        fVar44 = auVar42._4_4_ * fVar45;
        IVar48.x = (*points).x + fVar37;
        IVar48.y = (*points).y + fVar44;
        pIVar8[1] = IVar48;
        IVar49.x = (*points).x - fVar37;
        IVar49.y = (*points).y - fVar44;
        pIVar8[2] = IVar49;
        IVar38.x = (*points).x - fVar35 * fVar29;
        IVar38.y = (*points).y - fVar45 * fVar29;
        pIVar8[3] = IVar38;
        IVar39.x = points[uVar22].x + pIVar14[uVar22].x * fVar29;
        IVar39.y = points[uVar22].y + pIVar14[uVar22].y * fVar29;
        uVar26 = (ulong)(uVar22 * 4);
        pIVar8[uVar26] = IVar39;
        IVar40.x = points[uVar22].x + pIVar14[uVar22].x * auVar42._4_4_;
        IVar40.y = points[uVar22].y + pIVar14[uVar22].y * auVar42._4_4_;
        pIVar8[uVar26 + 1] = IVar40;
        IVar7.y = points[uVar22].y - pIVar14[uVar22].y * auVar42._4_4_;
        IVar7.x = points[uVar22].x - pIVar14[uVar22].x * auVar42._4_4_;
        pIVar8[uVar26 + 2] = IVar7;
        IVar5.y = points[uVar22].y - pIVar14[uVar22].y * fVar29;
        IVar5.x = points[uVar22].x - pIVar14[uVar22].x * fVar29;
        pIVar8[uVar26 + 3] = IVar5;
      }
      else {
        if (thickness <= fVar36 || bVar17 != 0) {
          if (bVar17 != 0) {
            fVar36 = auVar42._4_4_ * 0.5 + 1.0;
          }
          goto LAB_0019caaf;
        }
        auVar42._4_4_ = (auVar42._4_4_ - fVar36) * 0.5;
      }
      puVar20 = this->_IdxWritePtr;
      uVar26 = 1;
      uVar22 = this->_VtxCurrentIdx;
      do {
        uVar21 = uVar26 & 0xffffffff;
        if (uVar9 == uVar26) {
          uVar21 = 0;
        }
        uVar27 = uVar22 + 4;
        if (uVar9 == uVar26) {
          uVar27 = this->_VtxCurrentIdx;
        }
        fVar29 = (pIVar14[uVar21].x + pIVar14[uVar26 - 1].x) * 0.5;
        fVar35 = (pIVar14[uVar21].y + pIVar14[uVar26 - 1].y) * 0.5;
        fVar45 = fVar29 * fVar29 + fVar35 * fVar35;
        if (1e-06 < fVar45) {
          fVar45 = 1.0 / fVar45;
          fVar37 = 100.0;
          if (fVar45 <= 100.0) {
            fVar37 = fVar45;
          }
          fVar29 = fVar29 * fVar37;
          fVar35 = fVar35 * fVar37;
        }
        fVar45 = (fVar36 + auVar42._4_4_) * fVar29;
        fVar37 = (fVar36 + auVar42._4_4_) * fVar35;
        uVar19 = (ulong)(uint)((int)uVar21 * 4);
        IVar50.x = points[uVar21].x + fVar45;
        IVar50.y = points[uVar21].y + fVar37;
        pIVar8[uVar19] = IVar50;
        IVar51.x = points[uVar21].x + fVar29 * auVar42._4_4_;
        IVar51.y = points[uVar21].y + fVar35 * auVar42._4_4_;
        pIVar8[uVar19 + 1] = IVar51;
        IVar52.x = points[uVar21].x - fVar29 * auVar42._4_4_;
        IVar52.y = points[uVar21].y - fVar35 * auVar42._4_4_;
        pIVar8[uVar19 + 2] = IVar52;
        IVar41.x = points[uVar21].x - fVar45;
        IVar41.y = points[uVar21].y - fVar37;
        pIVar8[uVar19 + 3] = IVar41;
        uVar18 = uVar27 + 1;
        *puVar20 = uVar18;
        puVar20[1] = uVar22 + 1;
        uVar1 = uVar22 + 2;
        puVar20[2] = uVar1;
        puVar20[3] = uVar1;
        uVar12 = uVar27 + 2;
        puVar20[4] = uVar12;
        puVar20[5] = uVar18;
        puVar20[6] = uVar18;
        puVar20[7] = uVar22 + 1;
        puVar20[8] = uVar22;
        puVar20[9] = uVar22;
        puVar20[10] = uVar27;
        puVar20[0xb] = uVar18;
        puVar20[0xc] = uVar12;
        puVar20[0xd] = uVar1;
        puVar20[0xe] = uVar22 + 3;
        puVar20[0xf] = uVar22 + 3;
        puVar20[0x10] = uVar27 + 3;
        puVar20[0x11] = uVar12;
        puVar20 = puVar20 + 0x12;
        bVar28 = uVar26 != uVar25;
        uVar26 = uVar26 + 1;
        uVar22 = uVar27;
      } while (bVar28);
      this->_IdxWritePtr = puVar20;
      pIVar16 = this->_VtxWritePtr;
      pIVar14 = pIVar14 + uVar9 + 3;
      do {
        pIVar16->pos = pIVar14[-3];
        this->_VtxWritePtr->uv = IVar3;
        pIVar16 = this->_VtxWritePtr;
        pIVar16->col = uVar24;
        pIVar16[1].pos = pIVar14[-2];
        this->_VtxWritePtr[1].uv = IVar3;
        pIVar16 = this->_VtxWritePtr;
        pIVar16[1].col = col;
        pIVar16[2].pos = pIVar14[-1];
        this->_VtxWritePtr[2].uv = IVar3;
        pIVar16 = this->_VtxWritePtr;
        pIVar16[2].col = col;
        pIVar16[3].pos = *pIVar14;
        this->_VtxWritePtr[3].uv = IVar3;
        pIVar16 = this->_VtxWritePtr;
        pIVar16[3].col = uVar24;
        pIVar16 = pIVar16 + 4;
        this->_VtxWritePtr = pIVar16;
        pIVar14 = pIVar14 + 4;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
LAB_0019cf73:
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + iVar11;
    }
  }
  return;
LAB_0019cbdb:
  uVar26 = uVar26 + 1;
  uVar22 = uVar27;
  goto LAB_0019cae0;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, ImDrawFlags flags, float thickness)
{
    if (points_count < 2 || (col & IM_COL32_A_MASK) == 0)
        return;

    const bool closed = (flags & ImDrawFlags_Closed) != 0;
    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        _Data->TempBuffer.reserve_discard(points_count * ((use_texture || !thick_line) ? 3 : 5));
        ImVec2* temp_normals = _Data->TempBuffer.Data;
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}